

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_add_many(roaring_bitmap_t *r,size_t n_args,uint32_t *vals)

{
  uint32_t val;
  uint val_00;
  container_t *c;
  container_t *pcVar1;
  uint uVar2;
  uint32_t *puVar3;
  long lVar4;
  uint8_t typecode_00;
  uint8_t typecode_1;
  uint8_t typecode;
  int idx_1;
  int idx;
  uint8_t local_5b;
  uint8_t local_5a;
  uint8_t local_59;
  int local_58;
  int local_54;
  uint32_t *local_50;
  roaring_bitmap_t *local_48;
  long local_40;
  int local_34;
  
  if (n_args != 0) {
    val = *vals;
    local_50 = vals;
    local_48 = r;
    c = containerptr_roaring_bitmap_add(r,val,&local_59,&local_34);
    uVar2 = val >> 0x10;
    local_58 = local_34;
    local_40 = n_args << 2;
    lVar4 = 0;
    puVar3 = local_50;
    typecode_00 = local_59;
    do {
      val_00 = *(uint *)((long)puVar3 + lVar4);
      if ((c == (container_t *)0x0) || (val_00 >> 0x10 != uVar2)) {
        c = containerptr_roaring_bitmap_add(local_48,val_00,&local_5a,&local_54);
        local_58 = local_54;
        typecode_00 = local_5a;
        uVar2 = val_00 >> 0x10;
      }
      else {
        pcVar1 = container_add(c,(uint16_t)val_00,typecode_00,&local_5b);
        puVar3 = local_50;
        if (pcVar1 != c) {
          container_free(c,typecode_00);
          (local_48->high_low_container).containers[local_58] = pcVar1;
          (local_48->high_low_container).typecodes[local_58] = local_5b;
          c = pcVar1;
          puVar3 = local_50;
          typecode_00 = local_5b;
        }
      }
      lVar4 = lVar4 + 4;
    } while (local_40 != lVar4);
  }
  return;
}

Assistant:

void roaring_bitmap_add_many(roaring_bitmap_t *r, size_t n_args,
                             const uint32_t *vals) {
    uint32_t val;
    const uint32_t *start = vals;
    const uint32_t *end = vals + n_args;
    const uint32_t *current_val = start;

    if (n_args == 0) {
        return;
    }

    uint8_t typecode;
    int idx;
    container_t *container;
    val = *current_val;
    container = containerptr_roaring_bitmap_add(r, val, &typecode, &idx);
    roaring_bulk_context_t context = {container, idx, (uint16_t)(val >> 16),
                                      typecode};

    for (; current_val != end; current_val++) {
        memcpy(&val, current_val, sizeof(val));
        add_bulk_impl(r, &context, val);
    }
}